

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O3

void __thiscall Node::AddList(Node *this,string *name,string *value)

{
  pointer pcVar1;
  Node *pNVar2;
  mapped_type *pmVar3;
  shared_ptr<Node> list_node;
  bool local_8a;
  undefined1 local_89;
  Node *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  shared_ptr<Node> local_78;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  key_type local_48;
  
  local_8a = true;
  local_88 = (Node *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Node,std::allocator<Node>,std::__cxx11::string&,bool>
            (&local_80,&local_88,(allocator<Node> *)&local_89,name,&local_8a);
  pNVar2 = local_88;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"List","");
  pcVar1 = (value->_M_dataplus)._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar1,pcVar1 + value->_M_string_length);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&pNVar2->_attributes,&local_48);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_78.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_88;
  local_78.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_80._M_pi;
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_80._M_pi)->_M_use_count = (local_80._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_80._M_pi)->_M_use_count = (local_80._M_pi)->_M_use_count + 1;
    }
  }
  AddChild(this,&local_78);
  if (local_78.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
  return;
}

Assistant:

void Node::AddList(std::string name, std::string value) {
    std::shared_ptr<Node> list_node = std::make_shared<Node>(name, true);
    list_node->AddAttribute("List", value);
    this->AddChild(list_node);
}